

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal_input_parser.cpp
# Opt level: O2

void __thiscall ftxui::TerminalInputParser::Send(TerminalInputParser *this,Output output)

{
  _Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false> _Var1;
  string *this_00;
  string local_1a0;
  undefined1 local_180 [64];
  string local_140;
  undefined1 local_120 [64];
  string local_e0;
  undefined1 local_c0 [64];
  string local_80;
  undefined1 local_60 [64];
  
  switch(output.type) {
  case DROP:
    goto switchD_0013c02b_caseD_1;
  case CHARACTER:
    _Var1._M_head_impl =
         (this->out_)._M_t.
         super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_80,(string *)&this->pending_);
    Event::Character((Event *)local_60,&local_80);
    SenderImpl<ftxui::Event>::Send(_Var1._M_head_impl,(Event *)local_60);
    std::__cxx11::string::~string((string *)(local_60 + 0x18));
    this_00 = &local_80;
    break;
  case SPECIAL:
    _Var1._M_head_impl =
         (this->out_)._M_t.
         super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_e0,(string *)&this->pending_);
    Event::Special((Event *)local_c0,&local_e0);
    SenderImpl<ftxui::Event>::Send(_Var1._M_head_impl,(Event *)local_c0);
    std::__cxx11::string::~string((string *)(local_c0 + 0x18));
    this_00 = &local_e0;
    break;
  case MOUSE:
    _Var1._M_head_impl =
         (this->out_)._M_t.
         super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_140,(string *)&this->pending_);
    Event::Mouse((Event *)local_120,&local_140,output.field_1.mouse);
    SenderImpl<ftxui::Event>::Send(_Var1._M_head_impl,(Event *)local_120);
    std::__cxx11::string::~string((string *)(local_120 + 0x18));
    this_00 = &local_140;
    break;
  case CURSOR_REPORTING:
    _Var1._M_head_impl =
         (this->out_)._M_t.
         super___uniq_ptr_impl<ftxui::SenderImpl<ftxui::Event>,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_std::default_delete<ftxui::SenderImpl<ftxui::Event>_>_>
         .super__Head_base<0UL,_ftxui::SenderImpl<ftxui::Event>_*,_false>._M_head_impl;
    std::__cxx11::string::string((string *)&local_1a0,(string *)&this->pending_);
    Event::CursorReporting
              ((Event *)local_180,&local_1a0,output.field_1.cursor.x,output.field_1.cursor.y);
    SenderImpl<ftxui::Event>::Send(_Var1._M_head_impl,(Event *)local_180);
    std::__cxx11::string::~string((string *)(local_180 + 0x18));
    this_00 = &local_1a0;
    break;
  default:
    return;
  }
  std::__cxx11::string::~string((string *)this_00);
switchD_0013c02b_caseD_1:
  (this->pending_)._M_string_length = 0;
  *(this->pending_)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void TerminalInputParser::Send(TerminalInputParser::Output output) {
  switch (output.type) {
    case UNCOMPLETED:
      return;

    case DROP:
      pending_.clear();
      return;

    case CHARACTER:
      out_->Send(Event::Character(std::move(pending_)));
      pending_.clear();
      return;

    case SPECIAL:
      out_->Send(Event::Special(std::move(pending_)));
      pending_.clear();
      return;

    case MOUSE:
      out_->Send(Event::Mouse(std::move(pending_), output.mouse));
      pending_.clear();
      return;

    case CURSOR_REPORTING:
      out_->Send(Event::CursorReporting(std::move(pending_), output.cursor.x,
                                        output.cursor.y));
      pending_.clear();
      return;
  }
  // NOT_REACHED().
}